

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# densehashtable.h
# Opt level: O2

void __thiscall
google::
dense_hashtable<std::pair<const_int,_DenseIntMap<int>_>,_int,_Hasher,_google::dense_hash_map<int,_DenseIntMap<int>,_Hasher,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_int,_DenseIntMap<int>_>_>_>::SelectKey,_google::dense_hash_map<int,_DenseIntMap<int>,_Hasher,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_int,_DenseIntMap<int>_>_>_>::SetKey,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_int,_DenseIntMap<int>_>_>_>
::clear_to_size(dense_hashtable<std::pair<const_int,_DenseIntMap<int>_>,_int,_Hasher,_google::dense_hash_map<int,_DenseIntMap<int>,_Hasher,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_int,_DenseIntMap<int>_>_>_>::SelectKey,_google::dense_hash_map<int,_DenseIntMap<int>,_Hasher,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_int,_DenseIntMap<int>_>_>_>::SetKey,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_int,_DenseIntMap<int>_>_>_>
                *this,size_type new_num_buckets)

{
  pointer ppVar1;
  
  if (this->table == (pointer)0x0) {
    ppVar1 = (pointer)malloc(new_num_buckets * 0x58);
    this->table = ppVar1;
  }
  else {
    destroy_buckets(this,0,this->num_buckets);
    if (this->num_buckets != new_num_buckets) {
      resize_table(this,this->num_buckets,new_num_buckets);
    }
  }
  fill_range_with_empty(this,this->table,new_num_buckets);
  this->num_deleted = 0;
  this->num_elements = 0;
  this->num_buckets = new_num_buckets;
  sparsehash_internal::sh_hashtable_settings<int,_Hasher,_unsigned_long,_4>::reset_thresholds
            ((sh_hashtable_settings<int,_Hasher,_unsigned_long,_4> *)this,new_num_buckets);
  return;
}

Assistant:

void clear_to_size(size_type new_num_buckets) {
    if (!table) {
      table = val_info.allocate(new_num_buckets);
    } else {
      destroy_buckets(0, num_buckets);
      if (new_num_buckets != num_buckets) {  // resize, if necessary
        typedef std::integral_constant<
            bool, std::is_same<value_alloc_type,
                               libc_allocator_with_realloc<value_type>>::value>
            realloc_ok;
        resize_table(num_buckets, new_num_buckets, realloc_ok());
      }
    }
    assert(table);
    fill_range_with_empty(table, new_num_buckets);
    num_elements = 0;
    num_deleted = 0;
    num_buckets = new_num_buckets;  // our new size
    settings.reset_thresholds(bucket_count());
  }